

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint llvm::APInt::tcMSB(WordType *parts,uint n)

{
  uint uVar1;
  uint local_1c;
  uint msb;
  uint n_local;
  WordType *parts_local;
  
  local_1c = n;
  do {
    local_1c = local_1c - 1;
    if (parts[local_1c] != 0) {
      uVar1 = partMSB(parts[local_1c]);
      return uVar1 + local_1c * 0x40;
    }
  } while (local_1c != 0);
  return 0xffffffff;
}

Assistant:

unsigned APInt::tcMSB(const WordType *parts, unsigned n) {
  do {
    --n;

    if (parts[n] != 0) {
      unsigned msb = partMSB(parts[n]);

      return msb + n * APINT_BITS_PER_WORD;
    }
  } while (n);

  return -1U;
}